

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Program __thiscall soul::heart::Parser::parse(Parser *this)

{
  bool bVar1;
  Module *pMVar2;
  reference pSVar3;
  RefCountedPtr<soul::Program::ProgramImpl> extraout_RDX;
  Parser *in_RSI;
  Program PVar4;
  ScannedTopLevelItem *item_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  *__range2_3;
  ScannedTopLevelItem *item_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  *__range2_2;
  ScannedTopLevelItem *item_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  *__range2_1;
  ScannedTopLevelItem *item;
  iterator __end2;
  iterator __begin2;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  *__range2;
  undefined1 local_58 [8];
  CodeLocation moduleLocation;
  undefined1 local_30 [8];
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  scannedTopLevelItems;
  Parser *this_local;
  
  checkVersionDeclaration(in_RSI);
  std::
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ::vector((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
            *)local_30);
  std::
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ::reserve((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
             *)local_30,0x80);
  while( true ) {
    moduleLocation.location.data = "$eof";
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&in_RSI->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,(TokenType)"$eof");
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    CodeLocation::CodeLocation
              ((CodeLocation *)local_58,
               &(in_RSI->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)in_RSI,"graph");
    if (bVar1) {
      pMVar2 = Program::addGraph(&in_RSI->program,-1);
      scanTopLevelItem(in_RSI,(CodeLocation *)local_58,
                       (vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                        *)local_30,pMVar2);
    }
    else {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)in_RSI,"processor");
      if (bVar1) {
        pMVar2 = Program::addProcessor(&in_RSI->program,-1);
        scanTopLevelItem(in_RSI,(CodeLocation *)local_58,
                         (vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                          *)local_30,pMVar2);
      }
      else {
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                ::matchIf<char_const*>
                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            *)in_RSI,"namespace");
        if (bVar1) {
          pMVar2 = Program::addNamespace(&in_RSI->program,-1);
          scanTopLevelItem(in_RSI,(CodeLocation *)local_58,
                           (vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                            *)local_30,pMVar2);
        }
        else {
          Errors::expectedTopLevelDecl<>();
          (*(in_RSI->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser[2])(in_RSI,&__range2);
          CompileMessage::~CompileMessage((CompileMessage *)&__range2);
        }
      }
    }
    CodeLocation::~CodeLocation((CodeLocation *)local_58);
  }
  __end2 = std::
           vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
           ::begin((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                    *)local_30);
  item = (ScannedTopLevelItem *)
         std::
         vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
         ::end((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
                                     *)&item), bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
             ::operator*(&__end2);
    parseModuleStructs(in_RSI,pSVar3);
    __gnu_cxx::
    __normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
             ::begin((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                      *)local_30);
  item_1 = (ScannedTopLevelItem *)
           std::
           vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
           ::end((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                  *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
                             *)&item_1), bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
             ::operator*(&__end2_1);
    parseFunctionDecls(in_RSI,pSVar3);
    __gnu_cxx::
    __normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
             ::begin((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                      *)local_30);
  item_2 = (ScannedTopLevelItem *)
           std::
           vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
           ::end((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                  *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
                             *)&item_2), bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
             ::operator*(&__end2_2);
    parseStateVariables(in_RSI,pSVar3);
    __gnu_cxx::
    __normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
    ::operator++(&__end2_2);
  }
  __end2_3 = std::
             vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
             ::begin((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                      *)local_30);
  item_3 = (ScannedTopLevelItem *)
           std::
           vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
           ::end((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                  *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_3,
                            (__normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
                             *)&item_3), bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
             ::operator*(&__end2_3);
    parseModule(in_RSI,pSVar3);
    __gnu_cxx::
    __normal_iterator<soul::heart::Parser::ScannedTopLevelItem_*,_std::vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>_>
    ::operator++(&__end2_3);
  }
  Program::Program((Program *)this,&in_RSI->program);
  std::
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ::~vector((vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
             *)local_30);
  PVar4.refHolder.object = extraout_RDX.object;
  PVar4.pimpl = (ProgramImpl *)this;
  return PVar4;
}

Assistant:

Program parse()
    {
        checkVersionDeclaration();

        std::vector<ScannedTopLevelItem> scannedTopLevelItems;
        scannedTopLevelItems.reserve (128);

        while (! matches (Token::eof))
        {
            auto moduleLocation = location;

            if (matchIf ("graph"))              scanTopLevelItem (moduleLocation, scannedTopLevelItems, program.addGraph());
            else if (matchIf ("processor"))     scanTopLevelItem (moduleLocation, scannedTopLevelItems, program.addProcessor());
            else if (matchIf ("namespace"))     scanTopLevelItem (moduleLocation, scannedTopLevelItems, program.addNamespace());
            else                                throwError (Errors::expectedTopLevelDecl());
        }

        for (auto& item : scannedTopLevelItems)  parseModuleStructs (item);
        for (auto& item : scannedTopLevelItems)  parseFunctionDecls (item);
        for (auto& item : scannedTopLevelItems)  parseStateVariables (item);
        for (auto& item : scannedTopLevelItems)  parseModule (item);

        return program;
    }